

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

uchar * glfwGetJoystickButtons(int joy,int *count)

{
  int *count_local;
  uchar *puStack_10;
  int joy_local;
  
  if (count != (int *)0x0) {
    *count = 0;
    if (_glfwInitialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      puStack_10 = (uchar *)0x0;
    }
    else if ((joy < 0) || (0xf < joy)) {
      _glfwInputError(0x10003,"Invalid joystick %i",(ulong)(uint)joy);
      puStack_10 = (uchar *)0x0;
    }
    else {
      puStack_10 = _glfwPlatformGetJoystickButtons(joy,count);
    }
    return puStack_10;
  }
  __assert_fail("count != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/glfw-3.2.1/src/input.c"
                ,0x23e,"const unsigned char *glfwGetJoystickButtons(int, int *)");
}

Assistant:

char* glfwGetJoystickButtons(int joy, int* count)
{
    assert(count != NULL);
    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (joy < 0 || joy > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick %i", joy);
        return NULL;
    }

    return _glfwPlatformGetJoystickButtons(joy, count);
}